

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_locate(Integer g_a,Integer *subscript,Integer *owner)

{
  short sVar1;
  C_Integer *pCVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  global_array_t *pgVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  Integer proc_s [7];
  long local_138 [33];
  
  lVar7 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar7)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_locate");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar7].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_locate");
    pnga_error((char *)local_138,g_a);
  }
  pgVar6 = GA;
  sVar1 = GA[lVar7].ndim;
  uVar10 = (uint)sVar1;
  lVar8 = (long)(int)uVar10;
  if (GA[lVar7].distr_type == 0) {
    *owner = -1;
    if (0 < sVar1) {
      lVar14 = 0;
      do {
        if (subscript[lVar14] < 1) {
          return 0;
        }
        if (pgVar6[g_a + 1000].dims[lVar14] < subscript[lVar14]) {
          return 0;
        }
        lVar14 = lVar14 + 1;
      } while (lVar8 != lVar14);
    }
    if (0 < sVar1) {
      pCVar2 = pgVar6[lVar7].mapc;
      lVar14 = 0;
      lVar12 = 0;
      do {
        lVar15 = subscript[lVar14];
        uVar11 = (uint)((double)lVar15 * pgVar6[lVar7].scale[lVar14]);
        uVar10 = pgVar6[lVar7].nblock[lVar14] - 1;
        if (pgVar6[lVar7].nblock[lVar14] != uVar11) {
          uVar10 = uVar11;
        }
        uVar13 = (ulong)(int)uVar10;
        if (lVar15 < pCVar2[lVar12 + uVar13]) {
          if ((int)uVar10 < 1) {
            uVar10 = uVar10 - 1;
LAB_00161c14:
            uVar11 = uVar10;
            bVar3 = false;
          }
          else {
            do {
              uVar11 = uVar10 - 1;
              bVar3 = pCVar2[lVar12 + (ulong)uVar11] <= lVar15;
              if (pCVar2[lVar12 + (ulong)uVar11] <= lVar15) goto LAB_00161c1b;
              uVar11 = uVar10 - 1;
              bVar4 = 0 < (int)uVar10;
              uVar10 = uVar11;
            } while (uVar11 != 0 && bVar4);
            uVar11 = 0xffffffff;
          }
        }
        else {
          uVar11 = pgVar6[lVar7].nblock[lVar14] - 1;
          if ((int)uVar11 <= (int)uVar10) goto LAB_00161c14;
          lVar17 = 0;
          do {
            bVar3 = lVar15 < pCVar2[lVar12 + uVar13 + lVar17 + 1];
            if (lVar15 < pCVar2[lVar12 + uVar13 + lVar17 + 1]) {
              uVar11 = uVar10 + (int)lVar17;
              break;
            }
            lVar17 = lVar17 + 1;
          } while (~uVar13 + (long)pgVar6[lVar7].nblock[lVar14] != lVar17);
        }
LAB_00161c1b:
        if (!bVar3) {
          uVar11 = pgVar6[lVar7].nblock[lVar14] - 1;
        }
        local_138[lVar14] = (long)(int)uVar11;
        lVar12 = lVar12 + pgVar6[lVar7].nblock[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != lVar8);
    }
    if (sVar1 < 1) {
      lVar14 = 0;
    }
    else {
      lVar14 = 0;
      lVar15 = 0;
      lVar12 = 1;
      do {
        lVar17 = lVar12;
        if (lVar15 < lVar8 + -1) {
          lVar17 = pgVar6[g_a + 1000].nblock[lVar15] * lVar12;
        }
        lVar14 = lVar14 + lVar12 * local_138[lVar15];
        lVar15 = lVar15 + 1;
        lVar12 = lVar17;
      } while (lVar8 != lVar15);
    }
    *owner = lVar14;
    if (0 < pgVar6[lVar7].num_rstrctd) {
      *owner = pgVar6[lVar7].rstrctd_list[lVar14];
    }
  }
  else {
    if (GA[lVar7].distr_type == 4) {
      if (0 < sVar1) {
        pCVar2 = GA[lVar7].mapc;
        uVar13 = 0;
        lVar14 = 0;
        do {
          lVar12 = subscript[uVar13];
          uVar11 = (uint)((double)lVar12 * GA[lVar7].scale[uVar13]);
          if (GA[lVar7].num_blocks[uVar13] == (long)(int)uVar11) {
            uVar11 = (int)GA[lVar7].num_blocks[uVar13] - 1;
          }
          lVar15 = (long)(int)uVar11;
          if (lVar12 < pCVar2[lVar14 + lVar15]) {
            uVar5 = uVar11;
            if ((int)uVar11 < 1) {
              uVar11 = uVar11 - 1;
LAB_00161ae0:
              bVar3 = false;
            }
            else {
              do {
                uVar11 = uVar5 - 1;
                bVar3 = pCVar2[lVar14 + (ulong)uVar11] <= lVar12;
                if (pCVar2[lVar14 + (ulong)uVar11] <= lVar12) goto LAB_00161ae2;
                uVar11 = uVar5 - 1;
                bVar4 = 0 < (int)uVar5;
                uVar5 = uVar11;
              } while (uVar11 != 0 && bVar4);
              uVar11 = 0xffffffff;
            }
          }
          else {
            lVar17 = GA[lVar7].num_blocks[uVar13] + -1;
            if (lVar17 <= lVar15) goto LAB_00161ae0;
            lVar9 = (long)(int)(uVar11 + 1);
            if ((int)(uVar11 + 1) < lVar17) {
              lVar9 = lVar17;
            }
            do {
              bVar3 = lVar12 < (pCVar2 + 1)[lVar14 + lVar15];
              lVar16 = lVar15;
              if (lVar12 < (pCVar2 + 1)[lVar14 + lVar15]) break;
              lVar15 = lVar15 + 1;
              lVar16 = lVar9;
            } while (lVar15 < lVar17);
            uVar11 = (uint)lVar16;
          }
LAB_00161ae2:
          if (!bVar3) {
            uVar11 = (int)GA[lVar7].num_blocks[uVar13] - 1;
          }
          local_138[uVar13] = (long)(int)uVar11;
          lVar14 = lVar14 + GA[lVar7].num_blocks[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar10);
      }
    }
    else if (0 < sVar1) {
      uVar13 = 0;
      do {
        local_138[uVar13] = (subscript[uVar13] + -1) / GA[g_a + 1000].block_dims[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    lVar7 = local_138[lVar8 + -1];
    if (1 < sVar1) {
      uVar13 = (ulong)(uVar10 - 2);
      do {
        lVar7 = lVar7 * GA[g_a + 1000].num_blocks[uVar13] + local_138[uVar13];
        bVar3 = 0 < (long)uVar13;
        uVar13 = uVar13 - 1;
      } while (bVar3);
    }
    *owner = lVar7;
  }
  return 1;
}

Assistant:

logical pnga_locate(Integer g_a, Integer* subscript, Integer* owner)
{
Integer d, proc, dpos, ndim, ga_handle = GA_OFFSET + g_a, proc_s[MAXDIM];

   ga_check_handleM(g_a, "nga_locate");
   ndim = GA[ga_handle].ndim;

   if (GA[ga_handle].distr_type == REGULAR) {
     for(d=0, *owner=-1; d< ndim; d++) 
       if(subscript[d]< 1 || subscript[d]>GA[ga_handle].dims[d]) return FALSE;

     for(d = 0, dpos = 0; d< ndim; d++){
       findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d],
           GA[ga_handle].scale[d], subscript[d], &proc_s[d]);
       dpos += GA[ga_handle].nblock[d];
     }

     ga_ComputeIndexM(&proc, ndim, proc_s, GA[ga_handle].nblock); 

     *owner = proc;
     if (GA[ga_handle].num_rstrctd > 0) {
       *owner = GA[ga_handle].rstrctd_list[*owner];
     }
   } else {
     Integer i;
     Integer index[MAXDIM];
     gam_find_block_indices_from_subscript(ga_handle,subscript,index);
     gam_find_block_from_indices(ga_handle,i,index);    
     *owner = i;
   }
   
   return TRUE;
}